

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O3

TRef lj_opt_fwd_fload(jit_State *J)

{
  ushort uVar1;
  IRRef1 IVar2;
  IRIns *pIVar3;
  AliasRet AVar4;
  TRef TVar5;
  ushort uVar6;
  ulong uVar7;
  
  uVar1 = (J->fold).ins.field_0.op1;
  IVar2 = (J->fold).ins.field_0.op2;
  uVar6 = J->chain[0x4d];
  if (uVar1 < uVar6) {
    pIVar3 = (J->cur).ir;
    do {
      uVar7 = (ulong)uVar6;
      AVar4 = aa_fref(J,&(J->fold).ins,pIVar3 + pIVar3[uVar7].field_0.op1);
      if (AVar4 == ALIAS_MAY) goto LAB_0011c723;
      if (AVar4 == ALIAS_MUST) {
        return (TRef)*(ushort *)((long)pIVar3 + uVar7 * 8 + 2);
      }
      uVar6 = *(ushort *)((long)pIVar3 + uVar7 * 8 + 6);
    } while (uVar1 < uVar6);
  }
  uVar6 = uVar1;
  if ((IVar2 == 5) && ((byte)(*(char *)((long)(J->cur).ir + (ulong)uVar1 * 8 + 5) + 0xafU) < 2)) {
    TVar5 = lj_ir_knull(J,IRT_TAB);
    return TVar5;
  }
LAB_0011c723:
  TVar5 = lj_opt_cselim(J,(uint)uVar6);
  return TVar5;
}

Assistant:

TRef LJ_FASTCALL lj_opt_fwd_fload(jit_State *J)
{
  IRRef oref = fins->op1;  /* Object reference. */
  IRRef fid = fins->op2;  /* Field ID. */
  IRRef lim = oref;  /* Search limit. */
  IRRef ref;

  /* Search for conflicting stores. */
  ref = J->chain[IR_FSTORE];
  while (ref > oref) {
    IRIns *store = IR(ref);
    switch (aa_fref(J, fins, IR(store->op1))) {
    case ALIAS_NO:   break;  /* Continue searching. */
    case ALIAS_MAY:  lim = ref; goto cselim;  /* Limit search for load. */
    case ALIAS_MUST: return store->op2;  /* Store forwarding. */
    }
    ref = store->prev;
  }

  /* No conflicting store: const-fold field loads from allocations. */
  if (fid == IRFL_TAB_META) {
    IRIns *ir = IR(oref);
    if (ir->o == IR_TNEW || ir->o == IR_TDUP)
      return lj_ir_knull(J, IRT_TAB);
  }

cselim:
  /* Try to find a matching load. Below the conflicting store, if any. */
  return lj_opt_cselim(J, lim);
}